

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_impl.hpp
# Opt level: O1

void __thiscall toml::detail::location::retrace(location *this)

{
  element_type *peVar1;
  difference_type __d;
  long lVar2;
  size_t sVar3;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  prev;
  long local_28;
  undefined8 local_20;
  long local_18;
  
  sVar3 = this->location_;
  if (sVar3 == 0) {
    this->location_ = 0;
    this->line_number_ = 1;
    sVar3 = 1;
  }
  else {
    this->location_ = sVar3 - 1;
    peVar1 = (this->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if (*(char *)(lVar2 + -1 + sVar3) != '\n') {
      return;
    }
    this->line_number_ = this->line_number_ - 1;
    lVar2 = lVar2 + (sVar3 - 1);
    local_20 = (peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_18 = lVar2;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
              (&local_28);
    sVar3 = (lVar2 - local_28) + 1;
  }
  this->column_number_ = sVar3;
  return;
}

Assistant:

TOML11_INLINE void location::retrace(/*restricted to n=1*/) noexcept
{
    assert(this->is_ok());
    if(this->location_ == 0)
    {
        this->location_ = 0;
        this->line_number_ = 1;
        this->column_number_ = 1;
    }
    else
    {
        this->retrace_impl();
    }
}